

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

void __thiscall Qentem::Value<char>::RemoveIndex(Value<char> *this,SizeT index)

{
  bool bVar1;
  SizeT SVar2;
  Value<char> *pVVar3;
  SizeT index_local;
  Value<char> *this_local;
  
  bVar1 = isObject(this);
  if (bVar1) {
    HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
    RemoveIndex((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                 *)this,index);
  }
  else {
    bVar1 = isArray(this);
    if ((bVar1) &&
       (SVar2 = Array<Qentem::Value<char>_>::Size((Array<Qentem::Value<char>_> *)this),
       index < SVar2)) {
      pVVar3 = Array<Qentem::Value<char>_>::Storage((Array<Qentem::Value<char>_> *)this);
      Reset(pVVar3 + index);
    }
  }
  return;
}

Assistant:

void RemoveIndex(SizeT index) const noexcept {
        if (isObject()) {
            object_.RemoveIndex(index);
        } else if (isArray() && (index < array_.Size())) {
            (array_.Storage() + index)->Reset();
        }
    }